

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSendAig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Aig_Man_t *p;
  Gia_Man_t *p_00;
  char *pcVar4;
  char *pcVar5;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = true;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"ah"), iVar3 == 0x61) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x62) {
      Abc_Print(-2,"usage: send_aig -a\n");
      Abc_Print(-2,"\t         sends current AIG to the bridge\n");
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle sending AIG from &-space [default = %s]\n",pcVar4);
      if (!bVar2) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle sending netlist tagged as \"abstraction\". [default = %s]\n",
                pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0020f864:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  iVar3 = Abc_FrameIsBridgeMode();
  if (iVar3 == 0) {
    pcVar4 = "The bridge mode is not available.\n";
  }
  else if (bVar1) {
    if (pAbc->pGia != (Gia_Man_t *)0x0) {
      Gia_ManToBridgeAbsNetlist(_stdout,pAbc->pGia,0x6b - (uint)!bVar2);
      return 0;
    }
    pcVar4 = "There is no AIG in the &-space.\n";
  }
  else {
    pNtk = pAbc->pNtkCur;
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar4 = "There is no network in the main-space.\n";
    }
    else {
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        p = Abc_NtkToDar(pNtk,0,1);
        p_00 = Gia_ManFromAig(p);
        Aig_ManStop(p);
        Gia_ManToBridgeAbsNetlist(_stdout,p_00,0x6b - (uint)!bVar2);
        Gia_ManStop(p_00);
        return 0;
      }
      pcVar4 = "The main-space network is not an AIG.\n";
    }
  }
  iVar3 = -1;
  goto LAB_0020f864;
}

Assistant:

int Abc_CommandSendAig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    const int BRIDGE_NETLIST = 106;
//    const int BRIDGE_ABS_NETLIST = 107;

    int c, fAndSpace = 1, fAbsNetlist = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAndSpace ^= 1;
            break;
        case 'b':
            fAbsNetlist ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_FrameIsBridgeMode() )
    {
        Abc_Print( -1, "The bridge mode is not available.\n" );
        return 1;
    }
    if ( fAndSpace )
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "There is no AIG in the &-space.\n" );
            return 1;
        }
        Gia_ManToBridgeAbsNetlist( stdout, pAbc->pGia, fAbsNetlist ? BRIDGE_ABS_NETLIST : BRIDGE_NETLIST );
    }
    else
    {
        Aig_Man_t * pAig;
        Gia_Man_t * pGia;
        if ( pAbc->pNtkCur == NULL )
        {
            Abc_Print( -1, "There is no network in the main-space.\n" );
            return 1;
        }
        if ( !Abc_NtkIsStrash(pAbc->pNtkCur) )
        {
            Abc_Print( -1, "The main-space network is not an AIG.\n" );
            return 1;
        }
        pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        pGia = Gia_ManFromAig( pAig );
        Aig_ManStop( pAig );
        Gia_ManToBridgeAbsNetlist( stdout, pGia, fAbsNetlist ? BRIDGE_ABS_NETLIST : BRIDGE_NETLIST  );
        Gia_ManStop( pGia );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: send_aig -a\n" );
    Abc_Print( -2, "\t         sends current AIG to the bridge\n" );
    Abc_Print( -2, "\t-a     : toggle sending AIG from &-space [default = %s]\n", fAndSpace? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle sending netlist tagged as \"abstraction\". [default = %s]\n", fAbsNetlist? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}